

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_uart_lookup(char *uart_name)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  int local_1c;
  int i;
  char *uart_name_local;
  
  if (((plat != (mraa_board_t *)0x0) && (uart_name != (char *)0x0)) &&
     (sVar2 = strlen(uart_name), sVar2 != 0)) {
    local_1c = 0;
    do {
      if (plat->uart_dev_count <= local_1c) {
        return -1;
      }
      if (plat->uart_dev[local_1c].name != (char *)0x0) {
        __s2 = plat->uart_dev[local_1c].name;
        sVar2 = strlen(plat->uart_dev[local_1c].name);
        iVar1 = strncmp(uart_name,__s2,sVar2 + 1);
        if (iVar1 == 0) {
          return plat->uart_dev[local_1c].index;
        }
      }
      local_1c = local_1c + 1;
    } while( true );
  }
  return -1;
}

Assistant:

int
mraa_uart_lookup(const char* uart_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (uart_name == NULL || strlen(uart_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->uart_dev_count; i++) {
        if (plat->uart_dev[i].name != NULL &&
            strncmp(uart_name, plat->uart_dev[i].name, strlen(plat->uart_dev[i].name) + 1) == 0) {
            return plat->uart_dev[i].index;
        }
    }
    return -1;
}